

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O0

void __thiscall vkt::anon_unknown_0::TaskExecutorThread::run(TaskExecutorThread *this)

{
  Task *pTVar1;
  Task *task;
  TaskExecutorThread *this_local;
  
  while( true ) {
    pTVar1 = de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::popBack(this->m_tasks);
    if (pTVar1 == (Task *)0x0) break;
    (**pTVar1->_vptr_Task)();
  }
  return;
}

Assistant:

void run (void)
	{
		for (;;)
		{
			Task* const	task	= m_tasks.popBack();

			if (task)
				task->execute();
			else
				break; // End of tasks - time to terminate
		}
	}